

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlueRoomThree.cpp
# Opt level: O0

void __thiscall BlueRoomThree::BlueRoomThree(BlueRoomThree *this,string *rn,ItemTable *iList,bool f)

{
  allocator local_79;
  string local_78 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58 [55];
  byte local_21;
  ItemTable *pIStack_20;
  bool f_local;
  ItemTable *iList_local;
  string *rn_local;
  BlueRoomThree *this_local;
  
  local_21 = f;
  pIStack_20 = iList;
  iList_local = (ItemTable *)rn;
  rn_local = (string *)this;
  Room::Room(&this->super_Room);
  (this->super_Room)._vptr_Room = (_func_int **)&PTR_getDescription_abi_cxx11__00155848;
  (this->super_Room).table = pIStack_20;
  std::__cxx11::string::operator=((string *)&(this->super_Room).displayName,"Iced Piping");
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_78,
             "/workspace/llm4binary/github/license_all_cmakelists_25/originalname51[P]adventure_game/RoomDescriptions/"
             ,&local_79);
  std::operator+(local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_78);
  std::__cxx11::string::operator=((string *)&(this->super_Room).roomName,(string *)local_58);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  (this->super_Room).showLongDescription = (bool)(local_21 & 1);
  Room::parseData(&this->super_Room);
  return;
}

Assistant:

BlueRoomThree::BlueRoomThree(std::string rn, ItemTable *iList, bool f) {
    table = iList;
    displayName = "Iced Piping";
    roomName = std::string(RESOURCES_PATH) + rn;
    showLongDescription = f;
    parseData();
}